

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(cmExtraCodeLiteGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraCodeLiteGenerator_00599e20;
  std::__cxx11::string::string((string *)&this->ConfigName,"NoConfig",(allocator *)&local_38);
  (this->WorkspacePath)._M_dataplus._M_p = (pointer)&(this->WorkspacePath).field_2;
  (this->WorkspacePath)._M_string_length = 0;
  (this->WorkspacePath).field_2._M_local_buf[0] = '\0';
  this->CpuCount = 2;
  std::__cxx11::string::string((string *)&local_38,"Ninja",&local_39);
  this_00 = &(this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Unix Makefiles",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator()
  : cmExternalMakefileProjectGenerator()
  , ConfigName("NoConfig")
  , CpuCount(2)
{
#if defined(_WIN32)
  this->SupportedGlobalGenerators.push_back("MinGW Makefiles");
  this->SupportedGlobalGenerators.push_back("NMake Makefiles");
#endif
  this->SupportedGlobalGenerators.push_back("Ninja");
  this->SupportedGlobalGenerators.push_back("Unix Makefiles");
}